

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

Bool is_using_oam(Emulator *e,Bool write)

{
  Bool BVar1;
  bool local_1e;
  bool local_1d;
  Bool write_local;
  Emulator *e_local;
  
  if (write == FALSE) {
    local_1e = true;
    if (((e->state).ppu.stat.mode2.trigger == FALSE) &&
       (local_1e = true, (e->state).ppu.stat.mode != PPU_MODE_MODE2)) {
      local_1e = (e->state).ppu.stat.mode == PPU_MODE_MODE3;
    }
  }
  else {
    if ((e->state).ppu.stat.mode == PPU_MODE_MODE2) {
      BVar1 = is_almost_mode3(e);
      local_1d = true;
      local_1e = local_1d;
      if (BVar1 == FALSE) goto LAB_00115505;
    }
    local_1e = (e->state).ppu.stat.mode == PPU_MODE_MODE3;
  }
LAB_00115505:
  e_local._4_4_ = (Bool)local_1e;
  return e_local._4_4_;
}

Assistant:

static Bool is_using_oam(Emulator* e, Bool write) {
  if (write) {
    return (STAT.mode == PPU_MODE_MODE2 && !is_almost_mode3(e)) ||
           STAT.mode == PPU_MODE_MODE3;
  } else {
    return STAT.mode2.trigger || STAT.mode == PPU_MODE_MODE2 ||
           STAT.mode == PPU_MODE_MODE3;
  }
}